

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

int xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec,xmlChar *value,void *data,int compound)

{
  xmlRegTrans *pxVar1;
  uint uVar2;
  xmlRegexpPtr comp;
  xmlRegAtomPtr pxVar3;
  xmlRegCounter *pxVar4;
  xmlRegStatePtr pxVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  xmlRegStatePtr pxVar10;
  uint uVar11;
  xmlRegInputTokenPtr pxVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  xmlChar *str1;
  xmlRegTrans *pxVar16;
  uint uVar17;
  long lVar18;
  
  iVar7 = -1;
  if (((exec != (xmlRegExecCtxtPtr)0x0) && (comp = exec->comp, comp != (xmlRegexpPtr)0x0)) &&
     (iVar7 = exec->status, iVar7 == 0)) {
    if (comp->compact != (int *)0x0) {
      iVar7 = xmlRegCompactPushString(exec,comp,value,data);
      return iVar7;
    }
    if (value == (xmlChar *)0x0) {
      if (exec->state->type == XML_REGEXP_FINAL_STATE) {
        return 1;
      }
      str1 = (xmlChar *)0x0;
    }
    else {
      str1 = value;
      if (0 < exec->inputStackNr) {
        xmlFARegExecSaveInputString(exec,value,data);
        if (exec->status != 0) {
          return exec->status;
        }
        data = exec->inputStack[exec->index].data;
        str1 = exec->inputStack[exec->index].value;
      }
    }
    bVar6 = true;
    do {
      if (str1 == (xmlChar *)0x0) {
        if ((value != (xmlChar *)0x0) ||
           (pxVar10 = exec->state, pxVar10->type == XML_REGEXP_FINAL_STATE)) goto LAB_0017b54e;
        if (exec->counts != (int *)0x0) goto LAB_0017aec7;
        str1 = (xmlChar *)0x0;
LAB_0017b435:
        if (bVar6) {
          bVar6 = true;
          if ((exec->state != (xmlRegStatePtr)0x0) && (exec->state->type != XML_REGEXP_SINK_STATE))
          {
            iVar7 = xmlRegExecSetErrString(exec,str1);
            if (iVar7 < 0) {
              if (exec->status != 0) {
                return exec->status;
              }
LAB_0017b54e:
              return (uint)(exec->state->type == XML_REGEXP_FINAL_STATE);
            }
            exec->errState = exec->state;
            lVar15 = (long)exec->comp->nbCounters;
            if (lVar15 != 0) {
              memcpy(exec->errCounts,exec->counts,lVar15 << 2);
            }
            bVar6 = false;
          }
        }
        else {
          bVar6 = false;
        }
        exec->determinist = 0;
        xmlFARegExecRollBack(exec);
        pxVar12 = exec->inputStack;
        if (pxVar12 != (xmlRegInputTokenPtr)0x0) {
          if (exec->status != 0) {
            return exec->status;
          }
          iVar7 = exec->index;
LAB_0017b4de:
          str1 = pxVar12[iVar7].value;
          data = pxVar12[iVar7].data;
        }
      }
      else {
        pxVar10 = exec->state;
LAB_0017aec7:
        exec->transcount = 0;
        uVar17 = exec->transno;
        while (uVar2 = pxVar10->nbTrans, (int)uVar17 < (int)uVar2) {
          pxVar16 = pxVar10->trans;
          iVar7 = pxVar16[(int)uVar17].to;
          if (-1 < (long)iVar7) {
            pxVar1 = pxVar16 + (int)uVar17;
            pxVar3 = pxVar1->atom;
            uVar11 = pxVar1->count;
            uVar13 = (ulong)uVar11;
            if (uVar13 == 0x123457) {
              if (value == (xmlChar *)0x0 && str1 == (xmlChar *)0x0) {
                str1 = (xmlChar *)0x0;
                goto LAB_0017b2ba;
              }
              if (str1 == (xmlChar *)0x0) {
LAB_0017b254:
                str1 = (xmlChar *)0x0;
              }
              else if (0 < (int)uVar2) {
                lVar15 = 0;
                lVar18 = 0;
                do {
                  lVar14 = (long)*(int *)((long)&pxVar10->trans->counter + lVar15);
                  if ((-1 < lVar14) &&
                     (pxVar16 = (xmlRegTrans *)((long)&pxVar10->trans->atom + lVar15),
                     pxVar16 != pxVar1)) {
                    pxVar4 = exec->comp->counters;
                    iVar7 = exec->counts[lVar14];
                    if ((iVar7 < pxVar4[lVar14].max) &&
                       ((pxVar16->atom != (xmlRegAtomPtr)0x0 &&
                        (iVar8 = xmlStrEqual(str1,(xmlChar *)pxVar16->atom->valuep), iVar8 != 0))))
                    break;
                    if ((pxVar4[lVar14].min <= iVar7) &&
                       (((iVar7 < pxVar4[lVar14].max && (pxVar16->atom != (xmlRegAtomPtr)0x0)) &&
                        (iVar7 = xmlStrEqual(str1,(xmlChar *)pxVar16->atom->valuep), iVar7 != 0))))
                    goto LAB_0017b2ba;
                  }
                  lVar18 = lVar18 + 1;
                  pxVar10 = exec->state;
                  lVar15 = lVar15 + 0x18;
                } while (lVar18 < pxVar10->nbTrans);
              }
            }
            else {
              if (uVar11 == 0x123456) {
                if (0 < (int)uVar2) {
                  lVar15 = 0;
                  do {
                    if (((ulong)uVar17 * 0x18 != lVar15) &&
                       (uVar11 = *(uint *)((long)&pxVar16->counter + lVar15), -1 < (int)uVar11)) {
                      pxVar4 = exec->comp->counters;
                      if ((exec->counts[uVar11] < pxVar4[uVar11].min) ||
                         (pxVar4[uVar11].max < exec->counts[uVar11])) goto LAB_0017b2a1;
                    }
                    lVar15 = lVar15 + 0x18;
                    if ((ulong)uVar2 * 0x18 == lVar15) break;
                  } while( true );
                }
LAB_0017b2ba:
                if (((exec->callback != (xmlRegExecCallbacks)0x0) && (pxVar3 != (xmlRegAtomPtr)0x0))
                   && (data != (void *)0x0)) {
                  (*exec->callback)((xmlRegExecCtxtPtr)exec->data,(xmlChar *)pxVar3->valuep,
                                    pxVar3->data,data);
                }
                if (exec->transno + 1 < exec->state->nbTrans) {
                  if (exec->inputStackNr < 1) {
                    xmlFARegExecSaveInputString(exec,str1,data);
                  }
                  xmlFARegExecSave(exec);
                }
                if (-1 < (long)pxVar1->counter) {
                  exec->counts[pxVar1->counter] = exec->counts[pxVar1->counter] + 1;
                }
                if ((ulong)(uint)pxVar1->count < 0x123456) {
                  exec->counts[(uint)pxVar1->count] = 0;
                }
                pxVar10 = exec->comp->states[pxVar1->to];
                if (pxVar10 == (xmlRegStatePtr)0x0) {
                  pxVar10 = (xmlRegStatePtr)0x0;
                }
                else if (pxVar10->type == XML_REGEXP_SINK_STATE) {
                  iVar7 = xmlRegExecSetErrString(exec,str1);
                  if (iVar7 < 0) {
                    uVar17 = exec->transno;
                    break;
                  }
                  exec->errState = exec->state;
                  memcpy(exec->errCounts,exec->counts,(long)exec->comp->nbCounters << 2);
                  pxVar10 = exec->comp->states[pxVar1->to];
                }
                exec->state = pxVar10;
                exec->transno = 0;
                if (pxVar1->atom == (xmlRegAtomPtr)0x0) {
                  bVar6 = true;
                  goto LAB_0017b502;
                }
                pxVar12 = exec->inputStack;
                if (pxVar12 != (xmlRegInputTokenPtr)0x0) {
                  iVar7 = exec->index + 1;
                  exec->index = iVar7;
                  bVar6 = true;
                  if (iVar7 < exec->inputStackNr) goto LAB_0017b4de;
                }
                bVar6 = true;
                data = (void *)0x0;
                str1 = (xmlChar *)0x0;
                goto LAB_0017b502;
              }
              if ((int)uVar11 < 0) {
                if (pxVar3 == (xmlRegAtomPtr)0x0) {
                  exec->status = -4;
                  break;
                }
                if (str1 == (xmlChar *)0x0) goto LAB_0017b254;
                uVar9 = xmlRegStrEqualWildcard((xmlChar *)pxVar3->valuep,str1);
                uVar11 = uVar9 ^ 1;
                if (compound == 0) {
                  uVar11 = 0;
                }
                if (pxVar3->neg == 0) {
                  uVar11 = uVar9;
                }
                if ((uVar11 != 0) &&
                   ((lVar15 = (long)pxVar1->counter, lVar15 < 0 ||
                    (exec->counts[lVar15] < exec->comp->counters[lVar15].max)))) {
                  if ((pxVar3->min < 1) || (iVar8 = pxVar3->max, iVar8 < 1)) goto LAB_0017b2ba;
                  pxVar10 = exec->comp->states[iVar7];
                  if ((int)(uVar17 + 1) < (int)uVar2) {
                    if (exec->inputStackNr < 1) {
                      xmlFARegExecSaveInputString(exec,str1,data);
                    }
                    xmlFARegExecSave(exec);
                    iVar8 = pxVar3->max;
                  }
                  exec->transcount = 1;
                  iVar7 = 1;
                  uVar17 = 1;
                  if (iVar8 != 1) {
                    do {
                      iVar8 = exec->index;
                      lVar15 = (long)iVar8 + 1;
                      exec->index = (int)lVar15;
                      str1 = exec->inputStack[lVar15].value;
                      data = exec->inputStack[lVar15].data;
                      if (str1 == (xmlChar *)0x0) {
                        exec->index = iVar8;
                        uVar17 = 1;
                        str1 = (xmlChar *)0x0;
                        goto LAB_0017b28a;
                      }
                      if (pxVar3->min <= iVar7) {
                        iVar7 = exec->transno;
                        pxVar5 = exec->state;
                        exec->transno = -1;
                        exec->state = pxVar10;
                        if (exec->inputStackNr < 1) {
                          xmlFARegExecSaveInputString(exec,str1,data);
                        }
                        xmlFARegExecSave(exec);
                        exec->transno = iVar7;
                        exec->state = pxVar5;
                      }
                      uVar17 = xmlStrEqual(str1,(xmlChar *)pxVar3->valuep);
                      iVar7 = exec->transcount + 1;
                      exec->transcount = iVar7;
                      if (uVar17 != 1) goto LAB_0017b28a;
                    } while (iVar7 != pxVar3->max);
                    uVar17 = 1;
                  }
LAB_0017b28a:
                  if ((pxVar3->min <= iVar7) && (0 < (int)uVar17)) goto LAB_0017b29c;
                  goto LAB_0017b435;
                }
              }
              else {
                pxVar4 = exec->comp->counters;
                if (pxVar4[uVar13].min <= exec->counts[uVar13]) {
                  uVar17 = (uint)(exec->counts[uVar13] <= pxVar4[uVar13].max);
LAB_0017b29c:
                  if (uVar17 == 1) goto LAB_0017b2ba;
                }
              }
            }
          }
LAB_0017b2a1:
          uVar17 = exec->transno + 1;
          exec->transno = uVar17;
          pxVar10 = exec->state;
        }
        if ((uVar17 != 0) || (exec->state->nbTrans == 0)) goto LAB_0017b435;
      }
LAB_0017b502:
      iVar7 = exec->status;
    } while (iVar7 == 0);
  }
  return iVar7;
}

Assistant:

static int
xmlRegExecPushStringInternal(xmlRegExecCtxtPtr exec, const xmlChar *value,
	                     void *data, int compound) {
    xmlRegTransPtr trans;
    xmlRegAtomPtr atom;
    int ret;
    int final = 0;
    int progress = 1;

    if (exec == NULL)
	return(-1);
    if (exec->comp == NULL)
	return(-1);
    if (exec->status != XML_REGEXP_OK)
	return(exec->status);

    if (exec->comp->compact != NULL)
	return(xmlRegCompactPushString(exec, exec->comp, value, data));

    if (value == NULL) {
        if (exec->state->type == XML_REGEXP_FINAL_STATE)
	    return(1);
	final = 1;
    }

    /*
     * If we have an active rollback stack push the new value there
     * and get back to where we were left
     */
    if ((value != NULL) && (exec->inputStackNr > 0)) {
	xmlFARegExecSaveInputString(exec, value, data);
	value = exec->inputStack[exec->index].value;
	data = exec->inputStack[exec->index].data;
    }

    while ((exec->status == XML_REGEXP_OK) &&
	   ((value != NULL) ||
	    ((final == 1) &&
	     (exec->state->type != XML_REGEXP_FINAL_STATE)))) {

	/*
	 * End of input on non-terminal state, rollback, however we may
	 * still have epsilon like transition for counted transitions
	 * on counters, in that case don't break too early.
	 */
	if ((value == NULL) && (exec->counts == NULL))
	    goto rollback;

	exec->transcount = 0;
	for (;exec->transno < exec->state->nbTrans;exec->transno++) {
	    trans = &exec->state->trans[exec->transno];
	    if (trans->to < 0)
		continue;
	    atom = trans->atom;
	    ret = 0;
	    if (trans->count == REGEXP_ALL_LAX_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 0;

		/*
		 * Check all counted transitions from the current state
		 */
		if ((value == NULL) && (final)) {
		    ret = 1;
		} else if (value != NULL) {
		    for (i = 0;i < exec->state->nbTrans;i++) {
			t = &exec->state->trans[i];
			if ((t->counter < 0) || (t == trans))
			    continue;
			counter = &exec->comp->counters[t->counter];
			count = exec->counts[t->counter];
			if ((count < counter->max) &&
		            (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 0;
			    break;
			}
			if ((count >= counter->min) &&
			    (count < counter->max) &&
			    (t->atom != NULL) &&
			    (xmlStrEqual(value, t->atom->valuep))) {
			    ret = 1;
			    break;
			}
		    }
		}
	    } else if (trans->count == REGEXP_ALL_COUNTER) {
		int i;
		int count;
		xmlRegTransPtr t;
		xmlRegCounterPtr counter;

		ret = 1;

		/*
		 * Check all counted transitions from the current state
		 */
		for (i = 0;i < exec->state->nbTrans;i++) {
                    t = &exec->state->trans[i];
		    if ((t->counter < 0) || (t == trans))
			continue;
                    counter = &exec->comp->counters[t->counter];
		    count = exec->counts[t->counter];
		    if ((count < counter->min) || (count > counter->max)) {
			ret = 0;
			break;
		    }
		}
	    } else if (trans->count >= 0) {
		int count;
		xmlRegCounterPtr counter;

		/*
		 * A counted transition.
		 */

		count = exec->counts[trans->count];
		counter = &exec->comp->counters[trans->count];
		ret = ((count >= counter->min) && (count <= counter->max));
	    } else if (atom == NULL) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    } else if (value != NULL) {
		ret = xmlRegStrEqualWildcard(atom->valuep, value);
		if (atom->neg) {
		    ret = !ret;
		    if (!compound)
		        ret = 0;
		}
		if ((ret == 1) && (trans->counter >= 0)) {
		    xmlRegCounterPtr counter;
		    int count;

		    count = exec->counts[trans->counter];
		    counter = &exec->comp->counters[trans->counter];
		    if (count >= counter->max)
			ret = 0;
		}

		if ((ret == 1) && (atom->min > 0) && (atom->max > 0)) {
		    xmlRegStatePtr to = exec->comp->states[trans->to];

		    /*
		     * this is a multiple input sequence
		     */
		    if (exec->state->nbTrans > exec->transno + 1) {
			if (exec->inputStackNr <= 0) {
			    xmlFARegExecSaveInputString(exec, value, data);
			}
			xmlFARegExecSave(exec);
		    }
		    exec->transcount = 1;
		    do {
			/*
			 * Try to progress as much as possible on the input
			 */
			if (exec->transcount == atom->max) {
			    break;
			}
			exec->index++;
			value = exec->inputStack[exec->index].value;
			data = exec->inputStack[exec->index].data;

			/*
			 * End of input: stop here
			 */
			if (value == NULL) {
			    exec->index --;
			    break;
			}
			if (exec->transcount >= atom->min) {
			    int transno = exec->transno;
			    xmlRegStatePtr state = exec->state;

			    /*
			     * The transition is acceptable save it
			     */
			    exec->transno = -1; /* trick */
			    exec->state = to;
			    if (exec->inputStackNr <= 0) {
				xmlFARegExecSaveInputString(exec, value, data);
			    }
			    xmlFARegExecSave(exec);
			    exec->transno = transno;
			    exec->state = state;
			}
			ret = xmlStrEqual(value, atom->valuep);
			exec->transcount++;
		    } while (ret == 1);
		    if (exec->transcount < atom->min)
			ret = 0;

		    /*
		     * If the last check failed but one transition was found
		     * possible, rollback
		     */
		    if (ret < 0)
			ret = 0;
		    if (ret == 0) {
			goto rollback;
		    }
		}
	    }
	    if (ret == 1) {
		if ((exec->callback != NULL) && (atom != NULL) &&
			(data != NULL)) {
		    exec->callback(exec->data, atom->valuep,
			           atom->data, data);
		}
		if (exec->state->nbTrans > exec->transno + 1) {
		    if (exec->inputStackNr <= 0) {
			xmlFARegExecSaveInputString(exec, value, data);
		    }
		    xmlFARegExecSave(exec);
		}
		if (trans->counter >= 0) {
		    exec->counts[trans->counter]++;
		}
		if ((trans->count >= 0) &&
		    (trans->count < REGEXP_ALL_COUNTER)) {
		    exec->counts[trans->count] = 0;
		}
                if ((exec->comp->states[trans->to] != NULL) &&
		    (exec->comp->states[trans->to]->type ==
		     XML_REGEXP_SINK_STATE)) {
		    /*
		     * entering a sink state, save the current state as error
		     * state.
		     */
                    if (xmlRegExecSetErrString(exec, value) < 0)
                        break;
		    exec->errState = exec->state;
		    memcpy(exec->errCounts, exec->counts,
			   exec->comp->nbCounters * sizeof(int));
		}
		exec->state = exec->comp->states[trans->to];
		exec->transno = 0;
		if (trans->atom != NULL) {
		    if (exec->inputStack != NULL) {
			exec->index++;
			if (exec->index < exec->inputStackNr) {
			    value = exec->inputStack[exec->index].value;
			    data = exec->inputStack[exec->index].data;
			} else {
			    value = NULL;
			    data = NULL;
			}
		    } else {
			value = NULL;
			data = NULL;
		    }
		}
		goto progress;
	    } else if (ret < 0) {
		exec->status = XML_REGEXP_INTERNAL_ERROR;
		break;
	    }
	}
	if ((exec->transno != 0) || (exec->state->nbTrans == 0)) {
rollback:
            /*
	     * if we didn't yet rollback on the current input
	     * store the current state as the error state.
	     */
	    if ((progress) && (exec->state != NULL) &&
	        (exec->state->type != XML_REGEXP_SINK_STATE)) {
	        progress = 0;
                if (xmlRegExecSetErrString(exec, value) < 0)
                    break;
		exec->errState = exec->state;
                if (exec->comp->nbCounters)
                    memcpy(exec->errCounts, exec->counts,
                           exec->comp->nbCounters * sizeof(int));
	    }

	    /*
	     * Failed to find a way out
	     */
	    exec->determinist = 0;
	    xmlFARegExecRollBack(exec);
	    if ((exec->inputStack != NULL ) &&
                (exec->status == XML_REGEXP_OK)) {
		value = exec->inputStack[exec->index].value;
		data = exec->inputStack[exec->index].data;
	    }
	}
	continue;
progress:
        progress = 1;
    }
    if (exec->status == XML_REGEXP_OK) {
        return(exec->state->type == XML_REGEXP_FINAL_STATE);
    }
    return(exec->status);
}